

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# context.c
# Opt level: O2

void glfwMakeContextCurrent(GLFWwindow *handle)

{
  _GLFWwindow *p_Var1;
  int error;
  
  p_Var1 = _glfwPlatformGetCurrentContext();
  if (_glfw.initialized == 0) {
    error = 0x10001;
LAB_00114e43:
    _glfwInputError(error,(char *)0x0);
    return;
  }
  if (handle == (GLFWwindow *)0x0) {
    if (p_Var1 == (_GLFWwindow *)0x0) {
      return;
    }
  }
  else {
    if (*(int *)(handle + 0x1f0) == 0) {
      error = 0x1000a;
      goto LAB_00114e43;
    }
    if ((p_Var1 == (_GLFWwindow *)0x0) || (*(int *)(handle + 500) == (p_Var1->context).source))
    goto LAB_00114e32;
  }
  (*(p_Var1->context).makeCurrent)((_GLFWwindow *)0x0);
  if (handle == (GLFWwindow *)0x0) {
    return;
  }
LAB_00114e32:
  (**(code **)(handle + 0x238))(handle);
  return;
}

Assistant:

GLFWAPI void glfwMakeContextCurrent(GLFWwindow* handle)
{
    _GLFWwindow* window = (_GLFWwindow*) handle;
    _GLFWwindow* previous = _glfwPlatformGetCurrentContext();

    _GLFW_REQUIRE_INIT();

    if (window && window->context.client == GLFW_NO_API)
    {
        _glfwInputError(GLFW_NO_WINDOW_CONTEXT, NULL);
        return;
    }

    if (previous)
    {
        if (!window || window->context.source != previous->context.source)
            previous->context.makeCurrent(NULL);
    }

    if (window)
        window->context.makeCurrent(window);
}